

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<prometheus::(anonymous_namespace)::CheckLabelNameTest_trailing_invalid_label_name_Test>
::CreateTest(ParameterizedTestFactory<prometheus::(anonymous_namespace)::CheckLabelNameTest_trailing_invalid_label_name_Test>
             *this)

{
  Test *this_00;
  ParameterizedTestFactory<prometheus::(anonymous_namespace)::CheckLabelNameTest_trailing_invalid_label_name_Test>
  *this_local;
  
  WithParamInterface<prometheus::MetricType>::SetParam(&this->parameter_);
  this_00 = (Test *)operator_new(0x18);
  prometheus::anon_unknown_0::CheckLabelNameTest_trailing_invalid_label_name_Test::
  CheckLabelNameTest_trailing_invalid_label_name_Test
            ((CheckLabelNameTest_trailing_invalid_label_name_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }